

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O0

void __thiscall caldate_t::set_dayno(caldate_t *this,int32_t dayno)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int in_ESI;
  int *in_RDI;
  double dVar5;
  int32_t m;
  int32_t d;
  int32_t y;
  int local_14;
  int local_10;
  
  dVar5 = floor(((double)in_ESI * 10000.0 + 14780.0) / 3652425.0);
  local_10 = (int)dVar5;
  iVar1 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  iVar2 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  iVar3 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  local_14 = in_ESI - (((local_10 * 0x16d + iVar1) - iVar2) + iVar3);
  if (local_14 < 0) {
    local_10 = local_10 + -1;
    iVar1 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
    iVar2 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
    iVar3 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
    local_14 = in_ESI - (((local_10 * 0x16d + iVar1) - iVar2) + iVar3);
  }
  iVar4 = (local_14 * 100 + 0x34) / 0xbf4;
  *in_RDI = local_10 + (iVar4 + 2) / 0xc;
  in_RDI[1] = (iVar4 + 2) % 0xc + 1;
  in_RDI[2] = (local_14 - (iVar4 * 0x132 + 5) / 10) + 1;
  return;
}

Assistant:

void set_dayno(int32_t dayno)
    {
        int32_t y = (int32_t)floor((10000*(double)dayno + 14780)/3652425.0);
        int32_t d = dayno - (365*y + divfl(y, 4) - divfl(y, 100)
                             + divfl(y, 400));
        if (d < 0)
        {
            y -= 1;
            d = dayno - (365*y + divfl(y, 4) - divfl(y, 100) + divfl(y, 400));
        }
        int32_t m = (100*d + 52)/3060;

        this->y = y + (m+2)/12;
        this->m = (m + 2)%12 + 1;
        this->d = d - (m*306 + 5)/10 + 1;
    }